

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O2

bool __thiscall UnifiedRegex::CharTrie::IsDepthOne(CharTrie *this)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->isAccepting == false) {
    uVar1 = this->count;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    piVar3 = &(this->children->node).count;
    uVar5 = 0;
    do {
      if (uVar4 == uVar5) {
        return (long)(int)uVar1 <= (long)uVar5;
      }
      if (*(bool *)(piVar3 + -2) != true) {
        return false;
      }
      uVar5 = uVar5 + 1;
      iVar2 = *piVar3;
      piVar3 = piVar3 + 8;
    } while (iVar2 == 0);
  }
  return false;
}

Assistant:

bool CharTrie::IsDepthOne() const
    {
        if (isAccepting)
            return 0;
        for (int i = 0; i < count; i++)
        {
            if (!children[i].node.IsDepthZero())
                return false;
        }
        return true;
    }